

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ErfLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_erf(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x316) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x316;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    ErfLayerParams::ErfLayerParams(this_00.erf_);
    (this->layer_).erf_ = (ErfLayerParams *)this_00;
  }
  return (ErfLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ErfLayerParams* NeuralNetworkLayer::mutable_erf() {
  if (!has_erf()) {
    clear_layer();
    set_has_erf();
    layer_.erf_ = new ::CoreML::Specification::ErfLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.erf)
  return layer_.erf_;
}